

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Inc.hpp
# Opt level: O0

void __thiscall
Diligent::SerializedPipelineStateImpl::
CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
          (SerializedPipelineStateImpl *this,DeviceType Type,PipelineStateDesc *PSODesc,
          SHADER_TYPE ActiveShaderStageFlags,
          vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
          *ShaderStages)

{
  SerializationDeviceImpl *this_00;
  bool bVar1;
  SerializedResourceSignatureImpl **ppSignature;
  SerializedResourceSignatureImpl *pSVar2;
  char *Name;
  PipelineResourceSignatureDesc *pPVar3;
  DoublePtrHelper<Diligent::SerializedResourceSignatureImpl> local_120;
  undefined1 local_110 [8];
  PipelineResourceSignatureDescWrapper SignDesc;
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  *ShaderStages_local;
  SHADER_TYPE ActiveShaderStageFlags_local;
  PipelineStateDesc *PSODesc_local;
  DeviceType Type_local;
  SerializedPipelineStateImpl *this_local;
  
  SignDesc.m_Desc._48_8_ = ShaderStages;
  PipelineStateVkImpl::GetDefaultResourceSignatureDesc
            ((PipelineResourceSignatureDescWrapper *)local_110,ShaderStages,
             (PSODesc->super_DeviceObjectAttribs).Name,&PSODesc->ResourceLayout,
             PSODesc->SRBAllocationGranularity);
  bVar1 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator!
                    (&this->m_pDefaultSignature);
  if (bVar1) {
    this_00 = this->m_pSerializationDevice;
    RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator&
              ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)&local_120);
    ppSignature = Diligent::RefCntAutoPtr::DoublePtrHelper::
                  operator_cast_to_SerializedResourceSignatureImpl__((DoublePtrHelper *)&local_120);
    pPVar3 = PipelineResourceSignatureDescWrapper::Get
                       ((PipelineResourceSignatureDescWrapper *)local_110);
    SerializationDeviceImpl::CreateSerializedResourceSignature
              (this_00,ppSignature,(pPVar3->super_DeviceObjectAttribs).Name);
    RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::
    DoublePtrHelper<Diligent::SerializedResourceSignatureImpl>::~DoublePtrHelper(&local_120);
    bVar1 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator!
                      (&this->m_pDefaultSignature);
    if (bVar1) {
      LogError<true,char[54],char_const*,char[3]>
                (false,"CreateDefaultResourceSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                 ,0x5e,(char (*) [54])"Failed to create default resource signature for PSO \'",
                 (char **)PSODesc,(char (*) [3])"\'.");
    }
  }
  else {
    pSVar2 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator->
                       (&this->m_pDefaultSignature);
    Name = SerializedResourceSignatureImpl::GetName(pSVar2);
    PipelineResourceSignatureDescWrapper::SetName
              ((PipelineResourceSignatureDescWrapper *)local_110,Name);
  }
  pSVar2 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator->
                     (&this->m_pDefaultSignature);
  pPVar3 = PipelineResourceSignatureDescWrapper::operator_cast_to_PipelineResourceSignatureDesc_
                     ((PipelineResourceSignatureDescWrapper *)local_110);
  SerializedResourceSignatureImpl::CreateDeviceSignature<Diligent::PipelineResourceSignatureVkImpl>
            (pSVar2,Type,pPVar3,ActiveShaderStageFlags);
  PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
            ((PipelineResourceSignatureDescWrapper *)local_110);
  return;
}

Assistant:

void SerializedPipelineStateImpl::CreateDefaultResourceSignature(DeviceType                   Type,
                                                                 const PipelineStateDesc&     PSODesc,
                                                                 SHADER_TYPE                  ActiveShaderStageFlags,
                                                                 const ShaderStagesArrayType& ShaderStages,
                                                                 const ExtraArgsType&... ExtraArgs)
{
    auto SignDesc = PipelineStateImplType::GetDefaultResourceSignatureDesc(ShaderStages, PSODesc.Name, PSODesc.ResourceLayout, PSODesc.SRBAllocationGranularity, ExtraArgs...);
    if (!m_pDefaultSignature)
    {
        // Create empty serialized signature
        m_pSerializationDevice->CreateSerializedResourceSignature(&m_pDefaultSignature, SignDesc.Get().Name);
        if (!m_pDefaultSignature)
            LOG_ERROR_AND_THROW("Failed to create default resource signature for PSO '", PSODesc.Name, "'.");
    }
    else
    {
        // Override the name to make sure it is consistent for all devices
        SignDesc.SetName(m_pDefaultSignature->GetName());
    }

    m_pDefaultSignature->CreateDeviceSignature<SignatureImplType>(Type, SignDesc, ActiveShaderStageFlags);
}